

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O2

bool __thiscall ON_DimStyleExtra::Read(ON_DimStyleExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  int major_version;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_1c,&local_20);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, local_1c == 1)) {
    bVar2 = ON_BinaryArchive::ReadUuid(archive,&this->m_parent_dimstyle);
    if (((bVar2) &&
        ((((bVar2 = ON_BinaryArchive::ReadArray(archive,&this->m_valid_fields), bVar2 &&
           (bVar2 = ON_BinaryArchive::ReadInt(archive,&this->m_tolerance_style), bVar2)) &&
          (bVar2 = ON_BinaryArchive::ReadInt(archive,&this->m_tolerance_resolution), bVar2)) &&
         ((bVar2 = ON_BinaryArchive::ReadDouble(archive,&this->m_tolerance_upper_value), bVar2 &&
          (bVar2 = ON_BinaryArchive::ReadDouble(archive,&this->m_tolerance_lower_value), bVar2))))))
       && (bVar2 = ON_BinaryArchive::ReadDouble(archive,&this->m_tolerance_height_scale), bVar2)) {
      bVar2 = ON_BinaryArchive::ReadDouble(archive,&this->m_baseline_spacing);
    }
    else {
      bVar2 = false;
    }
  }
  if (0 < local_20) {
    if (bVar2 == false) {
      bVar2 = false;
    }
    else {
      bVar2 = ON_BinaryArchive::ReadBool(archive,&this->m_bDrawMask);
      if ((bVar2) && (bVar2 = ON_BinaryArchive::ReadInt(archive,&this->m_mask_color_source), bVar2))
      {
        bVar2 = ON_BinaryArchive::ReadColor(archive,&this->m_mask_color);
      }
      else {
        bVar2 = false;
      }
    }
    if (1 < local_20) {
      if (bVar2 != false) {
        bVar2 = ON_BinaryArchive::ReadDouble(archive,&this->m_dimscale);
      }
      if (bVar2 != false) {
        bVar2 = ON_BinaryArchive::ReadInt(archive,&this->m_dimscale_source);
      }
    }
    if ((2 < local_20) && (bVar2 != false)) {
      bVar2 = ON_BinaryArchive::ReadUuid(archive,&this->m_source_dimstyle);
    }
  }
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_DimStyleExtra::Read(ON_BinaryArchive& archive)
{
  // Changed to 1,0 for mask settings 12/12/09
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if(major_version != 1)
    rc = false;

  if(rc) rc = archive.ReadUuid(m_parent_dimstyle);
  if(rc) rc = archive.ReadArray(m_valid_fields);

  if(rc) rc = archive.ReadInt(&m_tolerance_style);
  if(rc) rc = archive.ReadInt(&m_tolerance_resolution);

  if(rc) rc = archive.ReadDouble(&m_tolerance_upper_value);
  if(rc) rc = archive.ReadDouble(&m_tolerance_lower_value);
  if(rc) rc = archive.ReadDouble(&m_tolerance_height_scale);

  if(rc) rc = archive.ReadDouble(&m_baseline_spacing);

  if(minor_version >= 1)
  {
    if(rc) rc = archive.ReadBool(&m_bDrawMask);
    if(rc) rc = archive.ReadInt(&m_mask_color_source);
    if(rc) rc = archive.ReadColor(m_mask_color);
  }

  if(minor_version >= 2)
  {
    if(rc) rc = archive.ReadDouble(&m_dimscale);
    if(rc) rc = archive.ReadInt(&m_dimscale_source);
  }

  if(minor_version >= 3)
  {
    if(rc) rc = archive.ReadUuid(m_source_dimstyle);
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}